

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fphdlimp.cpp
# Opt level: O1

void __thiscall
icu_63::FieldPositionIteratorHandler::addAttribute
          (FieldPositionIteratorHandler *this,int32_t id,int32_t start,int32_t limit)

{
  UErrorCode *status;
  int newSize;
  int iVar1;
  int iVar2;
  UVector32 *pUVar3;
  UBool UVar4;
  
  if (this->iter == (FieldPositionIterator *)0x0) {
    return;
  }
  if (limit <= start) {
    return;
  }
  if (U_ZERO_ERROR < this->status) {
    return;
  }
  status = &this->status;
  pUVar3 = this->vec;
  newSize = pUVar3->count;
  if (((-2 < newSize) && (newSize < pUVar3->capacity)) ||
     (UVar4 = UVector32::expandCapacity(pUVar3,newSize + 1,status), UVar4 != '\0')) {
    pUVar3->elements[pUVar3->count] = id;
    pUVar3->count = pUVar3->count + 1;
  }
  pUVar3 = this->vec;
  iVar1 = (this->super_FieldPositionHandler).fShift;
  iVar2 = pUVar3->count;
  if (((-2 < iVar2) && (iVar2 < pUVar3->capacity)) ||
     (UVar4 = UVector32::expandCapacity(pUVar3,iVar2 + 1,status), UVar4 != '\0')) {
    pUVar3->elements[pUVar3->count] = start + iVar1;
    pUVar3->count = pUVar3->count + 1;
  }
  pUVar3 = this->vec;
  iVar1 = (this->super_FieldPositionHandler).fShift;
  iVar2 = pUVar3->count;
  if (((-2 < iVar2) && (iVar2 < pUVar3->capacity)) ||
     (UVar4 = UVector32::expandCapacity(pUVar3,iVar2 + 1,status), UVar4 != '\0')) {
    pUVar3->elements[pUVar3->count] = limit + iVar1;
    pUVar3->count = pUVar3->count + 1;
  }
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    return;
  }
  UVector32::setSize(this->vec,newSize);
  return;
}

Assistant:

void
FieldPositionIteratorHandler::addAttribute(int32_t id, int32_t start, int32_t limit) {
  if (iter && U_SUCCESS(status) && start < limit) {
    int32_t size = vec->size();
    vec->addElement(id, status);
    vec->addElement(start + fShift, status);
    vec->addElement(limit + fShift, status);
    if (!U_SUCCESS(status)) {
      vec->setSize(size);
    }
  }
}